

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

StringLocalizationInfo * __thiscall icu_63::LocDataParser::doParse(LocDataParser *this)

{
  bool bVar1;
  void **ppvVar2;
  int32_t iVar3;
  UBool UVar4;
  UChar **elem;
  UChar *pUVar5;
  StringLocalizationInfo *pSVar6;
  UChar UVar7;
  UChar **in_RSI;
  bool bVar8;
  int32_t requiredLength;
  VArray array;
  int local_4c;
  VArray local_48;
  
  pUVar5 = this->p;
  if (pUVar5 < this->e) {
    do {
      UVar7 = this->ch;
      if (UVar7 == L'\xffff') {
        UVar7 = *pUVar5;
      }
      UVar4 = PatternProps::isWhiteSpace((uint)(ushort)UVar7);
      if (UVar4 == '\0') break;
      pUVar5 = this->p + 1;
      this->p = pUVar5;
      this->ch = L'\xffff';
    } while (pUVar5 < this->e);
  }
  pUVar5 = this->p;
  if ((this->e <= pUVar5) || ((this->ch != L'<' && (*pUVar5 != L'<')))) goto LAB_0021b49e;
  this->p = pUVar5 + 1;
  this->ch = L'\xffff';
  local_48.buf = (UChar ***)0x0;
  local_48.cap = 0;
  local_48.size = 0;
  local_48.deleter = DeleteFn;
  local_4c = -1;
  bVar8 = true;
  do {
    if (!bVar8) {
      pUVar5 = this->p;
      goto LAB_0021b3e6;
    }
    in_RSI = (UChar **)&local_4c;
    elem = nextArray(this,&local_4c);
    pUVar5 = this->p;
    while (pUVar5 < this->e) {
      UVar7 = this->ch;
      if (UVar7 == L'\xffff') {
        UVar7 = *pUVar5;
      }
      UVar4 = PatternProps::isWhiteSpace((uint)(ushort)UVar7);
      if (UVar4 == '\0') break;
      pUVar5 = this->p + 1;
      this->p = pUVar5;
      this->ch = L'\xffff';
    }
    bVar8 = true;
    if (this->p < this->e) {
      if (this->ch == L',') {
        bVar8 = false;
      }
      else {
        bVar8 = *this->p != L',';
      }
    }
    if (elem == (UChar **)0x0) {
      if (bVar8) goto LAB_0021b3c1;
      bVar1 = false;
      parseError(this,(char *)in_RSI);
      bVar8 = false;
    }
    else {
      VArray::add(&local_48,elem,this->ec);
      in_RSI = elem;
      if (bVar8) {
LAB_0021b3c1:
        bVar1 = true;
        bVar8 = false;
      }
      else {
        this->p = this->p + 1;
        this->ch = L'\xffff';
        bVar1 = true;
        bVar8 = true;
      }
    }
  } while (bVar1);
LAB_0021b489:
  bVar8 = false;
LAB_0021b48c:
  pSVar6 = (StringLocalizationInfo *)0x0;
LAB_0021b48f:
  VArray::~VArray(&local_48);
  if (!bVar8) {
    return pSVar6;
  }
LAB_0021b49e:
  parseError(this,(char *)in_RSI);
  return (StringLocalizationInfo *)0x0;
LAB_0021b3e6:
  if (this->e <= pUVar5) goto LAB_0021b419;
  UVar7 = this->ch;
  if (UVar7 == L'\xffff') {
    UVar7 = *pUVar5;
  }
  UVar4 = PatternProps::isWhiteSpace((uint)(ushort)UVar7);
  if (UVar4 == '\0') goto LAB_0021b419;
  pUVar5 = this->p + 1;
  this->p = pUVar5;
  this->ch = L'\xffff';
  goto LAB_0021b3e6;
LAB_0021b419:
  pUVar5 = this->p;
  if ((this->e <= pUVar5) || ((this->ch != L'>' && (*pUVar5 != L'>')))) {
LAB_0021b481:
    parseError(this,(char *)in_RSI);
    goto LAB_0021b489;
  }
  pUVar5 = pUVar5 + 1;
  this->p = pUVar5;
  this->ch = L'\xffff';
  if (pUVar5 < this->e) {
    do {
      UVar7 = this->ch;
      if (UVar7 == L'\xffff') {
        UVar7 = *pUVar5;
      }
      UVar4 = PatternProps::isWhiteSpace((uint)(ushort)UVar7);
      if (UVar4 == '\0') break;
      pUVar5 = this->p + 1;
      this->p = pUVar5;
      this->ch = L'\xffff';
    } while (pUVar5 < this->e);
  }
  if (this->p != this->e) goto LAB_0021b481;
  in_RSI = (UChar **)0x0;
  VArray::add(&local_48,(void *)0x0,this->ec);
  ppvVar2 = local_48.buf;
  if (U_ZERO_ERROR < *this->ec) {
    bVar8 = true;
    goto LAB_0021b48c;
  }
  iVar3 = local_48.size;
  local_48.buf = (UChar ***)0x0;
  local_48.cap = 0;
  local_48.size = 0;
  pSVar6 = (StringLocalizationInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
  if (pSVar6 == (StringLocalizationInfo *)0x0) goto LAB_0021b489;
  pUVar5 = this->data;
  (pSVar6->super_LocalizationInfo).refcount = 0;
  (pSVar6->super_LocalizationInfo)._vptr_LocalizationInfo =
       (_func_int **)&PTR__StringLocalizationInfo_003b2460;
  pSVar6->info = pUVar5;
  pSVar6->data = (UChar ***)ppvVar2;
  pSVar6->numRuleSets = local_4c + -2;
  pSVar6->numLocales = iVar3 + -2;
  bVar8 = false;
  goto LAB_0021b48f;
}

Assistant:

StringLocalizationInfo*
LocDataParser::doParse(void) {
    skipWhitespace();
    if (!checkInc(OPEN_ANGLE)) {
        ERROR("Missing open angle");
    } else {
        VArray array(DeleteFn);
        UBool mightHaveNext = TRUE;
        int32_t requiredLength = -1;
        while (mightHaveNext) {
            mightHaveNext = FALSE;
            UChar** elem = nextArray(requiredLength);
            skipWhitespace();
            UBool haveComma = check(COMMA);
            if (elem) {
                array.add(elem, ec);
                if (haveComma) {
                    inc();
                    mightHaveNext = TRUE;
                }
            } else if (haveComma) {
                ERROR("Unexpected character");
            }
        }

        skipWhitespace();
        if (!checkInc(CLOSE_ANGLE)) {
            if (check(OPEN_ANGLE)) {
                ERROR("Missing comma in outer array");
            } else {
                ERROR("Missing close angle bracket in outer array");
            }
        }

        skipWhitespace();
        if (p != e) {
            ERROR("Extra text after close of localization data");
        }

        array.add(NULL, ec);
        if (U_SUCCESS(ec)) {
            int32_t numLocs = array.length() - 2; // subtract first, NULL
            UChar*** result = (UChar***)array.release();
            
            return new StringLocalizationInfo(data, result, requiredLength-2, numLocs); // subtract first, NULL
        }
    }
  
    ERROR("Unknown error");
}